

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.h
# Opt level: O0

void __thiscall covenant::CFG::get_alphabet_min_and_max(CFG *this,int *min,int *max)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  reference this_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  reference piVar6;
  int *in_RDX;
  int *in_RSI;
  long in_RDI;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> RHS;
  int r;
  uint ri;
  uint vv;
  vector<int,_std::allocator<int>_> terminals;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff28;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff30;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> *in_stack_ffffffffffffff40;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff48;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff78;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> *in_stack_ffffffffffffff80;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_70;
  int local_68;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_58;
  int local_3c;
  uint local_38;
  uint local_34;
  int local_30 [6];
  int *local_18;
  int *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x218809);
  for (local_34 = 0; uVar2 = (ulong)local_34,
      sVar3 = std::
              vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
              ::size((vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                      *)(in_RDI + 0x40)), uVar2 < sVar3; local_34 = local_34 + 1) {
    local_38 = 0;
    while( true ) {
      uVar2 = (ulong)local_38;
      pvVar4 = std::
               vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
               ::operator[]((vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                             *)(in_RDI + 0x40),(ulong)local_34);
      sVar3 = std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>::size
                        (pvVar4);
      if (sVar3 <= uVar2) break;
      pvVar4 = std::
               vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
               ::operator[]((vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                             *)(in_RDI + 0x40),(ulong)local_34);
      pvVar5 = std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>::
               operator[](pvVar4,(ulong)local_38);
      local_3c = pvVar5->rule;
      std::
      vector<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
      ::operator[]((vector<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
                    *)(in_RDI + 0x58),(long)local_3c);
      std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                (in_stack_ffffffffffffff80,
                 (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                 in_stack_ffffffffffffff78._M_current);
      sVar3 = std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::size(&local_58);
      if (sVar3 == 1) {
        std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::operator[](&local_58,0);
        bVar1 = Sym::isTerm((Sym *)0x21890f);
        if (bVar1) {
          this_00 = std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::operator[]
                              (&local_58,0);
          local_68 = Sym::symID(this_00);
          std::vector<int,_std::allocator<int>_>::push_back
                    (in_stack_ffffffffffffff30,(value_type_conflict *)in_stack_ffffffffffffff28);
        }
      }
      std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::~vector(in_stack_ffffffffffffff40)
      ;
      local_38 = local_38 + 1;
    }
  }
  __last._M_current = local_30;
  std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff28);
  std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff28);
  __first = std::
            min_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                      (in_stack_ffffffffffffff48,__last);
  local_70 = __first;
  piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                     (&local_70);
  *local_10 = *piVar6;
  std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff28);
  std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff28);
  std::max_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (__first,__last);
  piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                     ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                      &stack0xffffffffffffff78);
  *local_18 = *piVar6;
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)__last._M_current);
  return;
}

Assistant:

void get_alphabet_min_and_max(int &min, int &max)
    {
      vector<int> terminals;
      for ( unsigned int vv = 0; vv < prods.size(); vv++ )
      {
        for ( unsigned int ri = 0; ri < prods[vv].size(); ri++ )
        {
          const int r = prods[vv][ri].rule;
          vector<Sym> RHS = rules[r];
          if (RHS.size() == 1 && RHS[0].isTerm())
            terminals.push_back(RHS[0].symID());
        }
      }
      min = *min_element(terminals.begin(), terminals.end());
      max = *max_element(terminals.begin(), terminals.end());
    }